

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_int<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,unsigned_long_long value,basic_format_specs<wchar_t> *spec)

{
  wchar_t spec_00;
  basic_format_specs<wchar_t> *in_RDX;
  int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_> *in_RDI;
  basic_format_specs<wchar_t> *in_stack_ffffffffffffffc8;
  unsigned_long_long in_stack_ffffffffffffffd0;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
  *in_stack_ffffffffffffffd8;
  int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_> *in_stack_ffffffffffffffe0;
  
  spec_00 = basic_format_specs<wchar_t>::type(in_RDX);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
  int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_>::int_writer
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  internal::
  handle_int_type_spec<wchar_t,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>>
            (spec_00,in_RDI);
  return;
}

Assistant:

void write_int(T value, const Spec &spec) {
    internal::handle_int_type_spec(spec.type(),
                                   int_writer<T, Spec>(*this, value, spec));
  }